

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

void __thiscall duckdb::Value::Value(Value *this,string *val)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var1;
  UnicodeType UVar2;
  InvalidInputException *__return_storage_ptr__;
  ExtraValueInfo *__tmp;
  undefined1 local_49;
  string local_48;
  
  LogicalType::LogicalType(&this->type_,VARCHAR);
  this->is_null = false;
  (this->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  UVar2 = Utf8Proc::Analyze((val->_M_dataplus)._M_p,val->_M_string_length,
                            (UnicodeInvalidReason *)0x0,(size_t *)0x0);
  if (UVar2 != INVALID) {
    local_48._M_dataplus._M_p = (pointer)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::StringValueInfo,std::allocator<duckdb::StringValueInfo>,std::__cxx11::string>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length,
               (StringValueInfo **)&local_48,(allocator<duckdb::StringValueInfo> *)&local_49,val);
    _Var1._M_p = local_48._M_dataplus._M_p;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_48._M_string_length + 8) =
             *(_Atomic_word *)(local_48._M_string_length + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_48._M_string_length + 8) =
             *(_Atomic_word *)(local_48._M_string_length + 8) + 1;
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
    }
    (this->value_info_).internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var1._M_p;
    this_00 = (this->value_info_).internal.
              super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (this->value_info_).internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    return;
  }
  __return_storage_ptr__ = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"value construction","");
  ErrorManager::InvalidUnicodeError(__return_storage_ptr__,val,&local_48);
  __cxa_throw(__return_storage_ptr__,&InvalidInputException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

Value::Value(string val) : type_(LogicalType::VARCHAR), is_null(false) {
	if (!Value::StringIsValid(val.c_str(), val.size())) {
		throw ErrorManager::InvalidUnicodeError(val, "value construction");
	}
	value_info_ = make_shared_ptr<StringValueInfo>(std::move(val));
}